

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest::ParseSchema
          (RetentionStripTest *this,string_view contents,string_view file_name)

{
  bool bVar1;
  int size;
  Descriptor *this_00;
  FileDescriptor *pFVar2;
  void *data;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  Arena *arena;
  Arg *in_R9;
  string_view format;
  LogMessage local_3a8;
  Voidify local_391;
  undefined1 local_390 [8];
  FileDescriptorProto file_descriptor;
  Parser parser;
  Tokenizer tokenizer;
  FakeErrorCollector error_collector;
  undefined1 local_138 [8];
  ArrayInputStream input_stream;
  Arg local_100;
  string_view local_d0;
  Arg local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined1 local_80 [8];
  string proto_file;
  RetentionStripTest *this_local;
  string_view file_name_local;
  string_view contents_local;
  
  proto_file.field_2._8_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,
             "\n          syntax = \"proto2\";\n\n          package google.protobuf.internal;\n\n          import \"$0\";\n\n          $1\n        "
            );
  this_00 = FileDescriptorSet::descriptor();
  pFVar2 = Descriptor::file(this_00);
  local_d0 = FileDescriptor::name(pFVar2);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_c0,local_d0);
  input_stream._24_8_ = contents._M_len;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_100,contents);
  format._M_str = (char *)&local_c0;
  format._M_len = (size_t)local_90._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            ((string *)local_80,(lts_20250127 *)local_90._M_len,format,&local_100,in_R9);
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  protobuf::io::ArrayInputStream::ArrayInputStream((ArrayInputStream *)local_138,data,size,-1);
  FakeErrorCollector::FakeErrorCollector((FakeErrorCollector *)&tokenizer.comment_style_);
  protobuf::io::Tokenizer::Tokenizer
            ((Tokenizer *)
             &parser.upcoming_detached_comments_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ZeroCopyInputStream *)local_138,
             (ErrorCollector *)&tokenizer.comment_style_);
  Parser::Parser((Parser *)((long)&file_descriptor.field_0 + 0xe0));
  Parser::RecordErrorsTo
            ((Parser *)((long)&file_descriptor.field_0 + 0xe0),
             (ErrorCollector *)&tokenizer.comment_style_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_390);
  bVar1 = Parser::Parse((Parser *)((long)&file_descriptor.field_0 + 0xe0),
                        (Tokenizer *)
                        &parser.upcoming_detached_comments_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (FileDescriptorProto *)local_390);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    puVar4 = protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        &file_descriptor.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar4 = (byte)*puVar4 | 1;
    arena = protobuf::MessageLite::GetArena((MessageLite *)local_390);
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               &file_descriptor.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
               file_name,arena);
    pFVar2 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_390);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_390);
    Parser::~Parser((Parser *)((long)&file_descriptor.field_0 + 0xe0));
    protobuf::io::Tokenizer::~Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    FakeErrorCollector::~FakeErrorCollector((FakeErrorCollector *)&tokenizer.comment_style_);
    protobuf::io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)local_138);
    std::__cxx11::string::~string((string *)local_80);
    return pFVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_3a8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x50,"parser.Parse(&tokenizer, &file_descriptor)");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3a8);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_391,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3a8)
  ;
}

Assistant:

const FileDescriptor* ParseSchema(absl::string_view contents,
                                    absl::string_view file_name = "foo.proto") {
    std::string proto_file = absl::Substitute(
        R"schema(
          syntax = "proto2";

          package google.protobuf.internal;

          import "$0";

          $1
        )schema",
        FileDescriptorSet::descriptor()->file()->name(), contents);
    io::ArrayInputStream input_stream(proto_file.data(),
                                      static_cast<int>(proto_file.size()));
    FakeErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto file_descriptor;
    ABSL_CHECK(parser.Parse(&tokenizer, &file_descriptor));
    file_descriptor.set_name(file_name);

    return pool_.BuildFile(file_descriptor);
  }